

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  char *pcVar9;
  string *psVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  CURL_conflict *data;
  ostream *poVar14;
  curl_slist *list;
  long *plVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_type *psVar17;
  value_type *val;
  ulong uVar18;
  string *h;
  pointer pbVar19;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> hash;
  string expectedHash;
  string err_2;
  string actualHash_1;
  cURLEasyGuard g_curl;
  cURLProgressHelper helper;
  string file;
  string dir;
  string statusVar;
  ofstream fout;
  cmFileCommandVectorOfChar chunkDebug;
  string status;
  string netrc_level;
  string hashMatchMSG;
  string logVar;
  string userpwd;
  string netrc_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string url;
  bool local_649;
  _Head_base<0UL,_cmCryptoHash_*,_false> local_648;
  long local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  undefined1 local_618 [8];
  char *local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608 [6];
  ios_base local_5a8 [264];
  string local_4a0;
  cURLEasyGuard local_480;
  undefined1 local_478 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  string local_448;
  string local_428;
  string local_408;
  undefined1 local_3e8 [8];
  size_type local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  byte abStack_3c8 [80];
  ios_base local_378 [136];
  ios_base local_2f0 [264];
  vector<char,_std::allocator<char>_> local_1e8;
  ulong local_1c8;
  char *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  undefined1 *local_178;
  undefined8 local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  string local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  string local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  cmCryptoHash *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x41) {
    local_3e8 = (undefined1  [8])&local_3d8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3e8,"DOWNLOAD must be called with at least three arguments.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
    if (local_3e8 != (undefined1  [8])&local_3d8) {
      operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
    }
    return false;
  }
  local_d8[0] = local_c8;
  pcVar2 = pbVar1[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_448,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  local_408._M_string_length = 0;
  local_408.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3e8 = (undefined1  [8])&local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"CMAKE_TLS_VERIFY","");
  local_649 = cmMakefile::IsOn(pcVar3,(string *)local_3e8);
  if (local_3e8 != (undefined1  [8])&local_3d8) {
    operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3e8 = (undefined1  [8])&local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"CMAKE_TLS_CAINFO","");
  pcVar9 = cmMakefile::GetDefinition(pcVar3,(string *)local_3e8);
  if (local_3e8 != (undefined1  [8])&local_3d8) {
    operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3e8 = (undefined1  [8])&local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"CMAKE_NETRC","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_3e8);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar2 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar2,pcVar2 + psVar10->_M_string_length);
  if (local_3e8 != (undefined1  [8])&local_3d8) {
    operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_cmCommand).Makefile;
  local_3e8 = (undefined1  [8])&local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"CMAKE_NETRC_FILE","");
  psVar10 = cmMakefile::GetSafeDefinition(pcVar3,(string *)local_3e8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar2 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar2,pcVar2 + psVar10->_M_string_length);
  val = pbVar1 + 3;
  local_1c0 = pcVar9;
  if (local_3e8 != (undefined1  [8])&local_3d8) {
    operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
  }
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  lVar12 = 0;
  local_638._M_string_length = 0;
  local_638.field_2._M_local_buf[0] = '\0';
  local_178 = &local_168;
  local_170 = 0;
  local_168 = 0;
  local_648._M_head_impl = (cmCryptoHash *)0x0;
  local_138 = &local_128;
  local_130 = 0;
  local_128 = 0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (val == (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish) {
    local_640 = 0;
    uVar18 = 0;
  }
  else {
    local_640 = 0;
    lVar12 = 0;
    local_1c8 = 0;
    do {
      iVar7 = std::__cxx11::string::compare((char *)val);
      if (iVar7 == 0) {
        val = val + 1;
        if (val == (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
          local_3e8 = (undefined1  [8])&local_3d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3e8,"DOWNLOAD missing time for TIMEOUT.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
          goto LAB_00203b50;
        }
        local_640 = atol((val->_M_dataplus)._M_p);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)val);
        if (iVar7 == 0) {
          val = val + 1;
          if (val == (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
            local_3e8 = (undefined1  [8])&local_3d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3e8,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
            goto LAB_00203b50;
          }
          lVar12 = atol((val->_M_dataplus)._M_p);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)val);
          if (iVar7 == 0) {
            val = val + 1;
            if (val == (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) {
              local_3e8 = (undefined1  [8])&local_3d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3e8,"DOWNLOAD missing VAR for LOG.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
              goto LAB_00203b50;
            }
            std::__cxx11::string::_M_assign((string *)&local_158);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)val);
            if (iVar7 == 0) {
              val = val + 1;
              if (val == (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish) {
                local_3e8 = (undefined1  [8])&local_3d8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3e8,"DOWNLOAD missing VAR for STATUS.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                goto LAB_00203b50;
              }
              std::__cxx11::string::_M_assign((string *)&local_408);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)val);
              if (iVar7 == 0) {
                val = val + 1;
                if (val == (args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish) {
                  local_3e8 = (undefined1  [8])&local_3d8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_3e8,"TLS_VERIFY missing bool value.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                  goto LAB_00203b50;
                }
                local_649 = cmSystemTools::IsOn(val);
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)val);
                if (iVar7 == 0) {
                  val = val + 1;
                  if (val == (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish) {
                    local_3e8 = (undefined1  [8])&local_3d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3e8,"TLS_CAFILE missing file value.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                    goto LAB_00203b50;
                  }
                  local_1c0 = (val->_M_dataplus)._M_p;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)val);
                  if (iVar7 == 0) {
                    val = val + 1;
                    if (val == (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish) {
                      local_3e8 = (undefined1  [8])&local_3d8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3e8,"DOWNLOAD missing file value for NETRC_FILE.",
                                 "");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                      goto LAB_00203b50;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_118);
                  }
                  else {
                    iVar7 = std::__cxx11::string::compare((char *)val);
                    if (iVar7 == 0) {
                      val = val + 1;
                      if (val == (args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish) {
                        local_3e8 = (undefined1  [8])&local_3d8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_3e8,"DOWNLOAD missing level value for NETRC.","")
                        ;
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                        goto LAB_00203b50;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_198);
                    }
                    else {
                      iVar7 = std::__cxx11::string::compare((char *)val);
                      if (iVar7 == 0) {
                        val = val + 1;
                        if (val == (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish) {
                          local_3e8 = (undefined1  [8])&local_3d8;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_3e8,
                                     "DOWNLOAD missing sum value for EXPECTED_MD5.","");
                          cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                          goto LAB_00203b50;
                        }
                        local_618 = (undefined1  [8])((ulong)local_618 & 0xffffffff00000000);
                        std::make_unique<cmCryptoHash,cmCryptoHash::Algo>((Algo *)local_3e8);
                        auVar4 = local_3e8;
                        local_3e8 = (undefined1  [8])0x0;
                        std::__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                        reset((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                              &local_648,(pointer)auVar4);
                        std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                        ~unique_ptr((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)
                                    local_3e8);
                        std::__cxx11::string::operator=((string *)&local_178,"MD5 sum");
                        cmsys::SystemTools::LowerCase((string *)local_3e8,val);
                        std::__cxx11::string::operator=((string *)&local_638,(string *)local_3e8);
LAB_00202e97:
                        if (local_3e8 != (undefined1  [8])&local_3d8) {
                          operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
                        }
                      }
                      else {
                        uVar11 = std::__cxx11::string::compare((char *)val);
                        if ((int)uVar11 == 0) {
                          local_1c8 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
                        }
                        else {
                          iVar7 = std::__cxx11::string::compare((char *)val);
                          if (iVar7 == 0) {
                            psVar10 = val + 1;
                            if (psVar10 ==
                                (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                              local_3e8 = (undefined1  [8])&local_3d8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3e8,
                                         "DOWNLOAD missing ALGO=value for EXPECTED_HASH.","");
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
LAB_00203b50:
                              if (local_3e8 != (undefined1  [8])&local_3d8) {
                                operator_delete((void *)local_3e8,
                                                local_3d8._M_allocated_capacity + 1);
                              }
                            }
                            else {
                              lVar13 = std::__cxx11::string::find((char *)psVar10,0x5493a0,0);
                              if (lVar13 == -1) {
                                local_3e8 = (undefined1  [8])&local_3d8;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_3e8,
                                           "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ","")
                                ;
                                std::__cxx11::string::_M_append
                                          (local_3e8,(ulong)val[1]._M_dataplus._M_p);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                                goto LAB_00203b50;
                              }
                              std::__cxx11::string::substr((ulong)local_3e8,(ulong)psVar10);
                              std::__cxx11::string::substr((ulong)local_478,(ulong)psVar10);
                              cmsys::SystemTools::LowerCase((string *)local_618,(string *)local_478)
                              ;
                              std::__cxx11::string::operator=
                                        ((string *)&local_638,(string *)local_618);
                              if (local_618 != (undefined1  [8])local_608) {
                                operator_delete((void *)local_618,
                                                CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                                         local_608[0]._M_local_buf[0]) + 1);
                              }
                              if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
                                operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
                              }
                              cmCryptoHash::New((cmCryptoHash *)local_618,(char *)local_3e8);
                              auVar4 = local_618;
                              local_618 = (undefined1  [8])0x0;
                              std::__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                              ::reset((__uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                       *)&local_648,(pointer)auVar4);
                              std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                              ~unique_ptr((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                           *)local_618);
                              local_b8 = local_648._M_head_impl;
                              if (local_648._M_head_impl == (cmCryptoHash *)0x0) {
                                local_618 = (undefined1  [8])local_608;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_618,
                                           "DOWNLOAD EXPECTED_HASH given unknown ALGO: ","");
                                std::__cxx11::string::_M_append(local_618,(ulong)local_3e8);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                              }
                              else {
                                std::operator+((string *)local_618,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_3e8," hash");
                                std::__cxx11::string::operator=
                                          ((string *)&local_178,(string *)local_618);
                              }
                              if (local_618 != (undefined1  [8])local_608) {
                                operator_delete((void *)local_618,
                                                CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                                         local_608[0]._M_local_buf[0]) + 1);
                              }
                              if (local_3e8 != (undefined1  [8])&local_3d8) {
                                operator_delete((void *)local_3e8,
                                                local_3d8._M_allocated_capacity + 1);
                              }
                              val = psVar10;
                              if (local_b8 != (cmCryptoHash *)0x0) goto LAB_00202d30;
                            }
                            bVar5 = false;
                            goto LAB_00203b77;
                          }
                          iVar7 = std::__cxx11::string::compare((char *)val);
                          if (iVar7 == 0) {
                            if (val + 1 ==
                                (args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                              local_3e8 = (undefined1  [8])&local_3d8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3e8,"DOWNLOAD missing string for USERPWD.",
                                         "");
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                              goto LAB_00203b50;
                            }
                            std::__cxx11::string::_M_assign((string *)&local_138);
                            val = val + 1;
                          }
                          else {
                            iVar7 = std::__cxx11::string::compare((char *)val);
                            if (iVar7 != 0) {
                              local_3e8 = (undefined1  [8])&local_3d8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3e8,"Unexpected argument: ","");
                              std::__cxx11::string::_M_append
                                        ((char *)local_3e8,(ulong)(val->_M_dataplus)._M_p);
                              cmMakefile::IssueMessage
                                        ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                         (string *)local_3e8);
                              goto LAB_00202e97;
                            }
                            val = val + 1;
                            if (val == (args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish) {
                              local_3e8 = (undefined1  [8])&local_3d8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3e8,
                                         "DOWNLOAD missing string for HTTPHEADER.","");
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
                              goto LAB_00203b50;
                            }
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(&local_f8,val);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_00202d30:
      val = val + 1;
      uVar18 = local_1c8;
    } while (val != (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar5 = cmsys::SystemTools::FileExists(&local_448);
  if ((bVar5) && (local_648._M_head_impl != (cmCryptoHash *)0x0)) {
    local_610 = (char *)0x0;
    local_608[0]._M_local_buf[0] = '\0';
    local_618 = (undefined1  [8])local_608;
    cmCryptoHash::HashFile((string *)local_478,local_648._M_head_impl,&local_448);
    if (local_478._8_8_ == local_638._M_string_length) {
      if ((cmFileCommand *)local_478._8_8_ == (cmFileCommand *)0x0) {
        bVar5 = true;
      }
      else {
        iVar7 = bcmp((void *)local_478._0_8_,local_638._M_dataplus._M_p,local_478._8_8_);
        bVar5 = iVar7 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5 == false) {
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      if (local_618 != (undefined1  [8])local_608) {
        operator_delete((void *)local_618,
                        CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                 local_608[0]._M_local_buf[0]) + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)local_618,0,local_610,0x52ac35);
      std::__cxx11::string::_M_append(local_618,(ulong)local_178);
      std::__cxx11::string::append(local_618);
      if (local_408._M_string_length != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
        poVar14 = (ostream *)std::ostream::operator<<(local_3e8,0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\"",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,(char *)local_618,(long)local_610);
        pcVar3 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::AddDefinition(pcVar3,&local_408,local_428._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
        std::ios_base::~ios_base(local_378);
      }
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      if (local_618 != (undefined1  [8])local_608) {
        operator_delete((void *)local_618,
                        CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                 local_608[0]._M_local_buf[0]) + 1);
      }
      if (bVar5 != false) goto LAB_00203b77;
    }
  }
  else {
    bVar5 = false;
  }
  cmsys::SystemTools::GetFilenamePath(&local_428,&local_448);
  bVar6 = cmsys::SystemTools::FileExists(&local_428);
  if ((bVar6) || (bVar6 = cmsys::SystemTools::MakeDirectory(&local_428,(mode_t *)0x0), bVar6)) {
    std::ofstream::ofstream(local_3e8,local_448._M_dataplus._M_p,_S_bin);
    if ((abStack_3c8[*(long *)((long)local_3e8 + -0x18)] & 5) == 0) {
      curl_global_init(3);
      data = curl_easy_init();
      if (data == (CURL_conflict *)0x0) {
        local_618 = (undefined1  [8])local_608;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_618,"DOWNLOAD error initializing curl.","");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
        goto LAB_0020322b;
      }
      local_480.Easy = data;
      CVar8 = curl_easy_setopt(data,CURLOPT_URL,local_d8[0]);
      if (CVar8 == CURLE_OK) {
        CVar8 = curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
        if (CVar8 != CURLE_OK) {
          local_618 = (undefined1  [8])local_608;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"DOWNLOAD cannot set http failure option: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_618);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
          goto LAB_00203953;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_USERAGENT,"curl/7.65.0");
        if (CVar8 != CURLE_OK) {
          local_618 = (undefined1  [8])local_608;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"DOWNLOAD cannot set user agent option: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_618);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
          goto LAB_00203953;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,
                                 anon_unknown.dwarf_648791::cmWriteToFileCallback);
        if (CVar8 != CURLE_OK) {
          local_618 = (undefined1  [8])local_608;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"DOWNLOAD cannot set write function: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_618);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
          goto LAB_00203953;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,
                                 anon_unknown.dwarf_648791::cmFileCommandCurlDebugCallback);
        if (CVar8 != CURLE_OK) {
          local_618 = (undefined1  [8])local_608;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"DOWNLOAD cannot set debug function: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_618);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
          goto LAB_00203953;
        }
        if (local_649 == false) {
          CVar8 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
          if (CVar8 == CURLE_OK) goto LAB_00203d42;
          local_618 = (undefined1  [8])local_608;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"Unable to set TLS/SSL Verify off: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_618);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
          goto LAB_00203953;
        }
        CVar8 = curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,1);
        if (CVar8 != CURLE_OK) {
          local_618 = (undefined1  [8])local_608;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_618,"Unable to set TLS/SSL Verify on: ","");
          curl_easy_strerror(CVar8);
          std::__cxx11::string::append(local_618);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
          goto LAB_00203953;
        }
LAB_00203d42:
        cmCurlSetCAInfo_abi_cxx11_(&local_70,data,local_1c0);
        if (local_70._M_string_length == 0) {
          cmsys::SystemTools::UpperCase((string *)local_618,&local_198);
          std::__cxx11::string::operator=((string *)&local_198,(string *)local_618);
          if (local_618 != (undefined1  [8])local_608) {
            operator_delete((void *)local_618,
                            CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                     local_608[0]._M_local_buf[0]) + 1);
          }
          cmCurlSetNETRCOption(&local_90,data,&local_198,&local_118);
          if (local_90._M_string_length == 0) {
            local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (char *)0x0;
            local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            CVar8 = curl_easy_setopt(data,CURLOPT_WRITEDATA,local_3e8);
            if (CVar8 == CURLE_OK) {
              CVar8 = curl_easy_setopt(data,CURLOPT_DEBUGDATA,&local_1e8);
              if (CVar8 != CURLE_OK) {
                local_618 = (undefined1  [8])local_608;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_618,"DOWNLOAD cannot set debug data: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_618);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                goto LAB_00203f34;
              }
              CVar8 = curl_easy_setopt(data,CURLOPT_FOLLOWLOCATION,1);
              if (CVar8 != CURLE_OK) {
                local_618 = (undefined1  [8])local_608;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_618,"DOWNLOAD cannot set follow-redirect option: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_618);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                goto LAB_00203f34;
              }
              if ((local_158._M_string_length != 0) &&
                 (CVar8 = curl_easy_setopt(data,CURLOPT_VERBOSE,1), CVar8 != CURLE_OK)) {
                local_618 = (undefined1  [8])local_608;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_618,"DOWNLOAD cannot set verbose: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_618);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                goto LAB_00203f34;
              }
              if ((0 < local_640) &&
                 (CVar8 = curl_easy_setopt(data,CURLOPT_TIMEOUT,local_640), CVar8 != CURLE_OK)) {
                local_618 = (undefined1  [8])local_608;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_618,"DOWNLOAD cannot set timeout: ","");
                curl_easy_strerror(CVar8);
                std::__cxx11::string::append(local_618);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                goto LAB_00203f34;
              }
              if (0 < lVar12) {
                curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
                curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,lVar12);
              }
              anon_unknown.dwarf_648791::cURLProgressHelper::cURLProgressHelper
                        ((cURLProgressHelper *)local_478,this,"download");
              if ((uVar18 & 1) == 0) {
LAB_002041ef:
                if ((local_130 != 0) &&
                   (CVar8 = curl_easy_setopt(data,CURLOPT_USERPWD,local_138), CVar8 != CURLE_OK)) {
                  local_618 = (undefined1  [8])local_608;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_618,"DOWNLOAD cannot set user password: ","");
                  curl_easy_strerror(CVar8);
                  std::__cxx11::string::append(local_618);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                  goto LAB_0020425e;
                }
                pbVar1 = local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                list = (curl_slist *)0x0;
                for (pbVar19 = local_f8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; pbVar19 != pbVar1;
                    pbVar19 = pbVar19 + 1) {
                  list = curl_slist_append(list,(pbVar19->_M_dataplus)._M_p);
                }
                curl_easy_setopt(data,CURLOPT_HTTPHEADER,list);
                CVar8 = curl_easy_perform(data);
                curl_slist_free_all(list);
                local_480.Easy = (CURL_conflict *)0x0;
                curl_easy_cleanup(data);
                if (local_408._M_string_length != 0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
                  poVar14 = (ostream *)std::ostream::operator<<(local_618,CVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\"",2);
                  pcVar9 = curl_easy_strerror(CVar8);
                  poVar14 = std::operator<<(poVar14,pcVar9);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"",1);
                  pcVar3 = (this->super_cmCommand).Makefile;
                  std::__cxx11::stringbuf::str();
                  cmMakefile::AddDefinition(pcVar3,&local_408,local_4a0._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                    operator_delete(local_4a0._M_dataplus._M_p,
                                    local_4a0.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
                  std::ios_base::~ios_base(local_5a8);
                }
                curl_global_cleanup();
                std::ostream::flush();
                std::ofstream::close();
                if (local_648._M_head_impl == (cmCryptoHash *)0x0) {
LAB_002047dc:
                  bVar5 = true;
                  if (local_158._M_string_length != 0) {
                    local_618 = (undefined1  [8])((ulong)local_618 & 0xffffffffffffff00);
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (&local_1e8,local_618);
                    cmMakefile::AddDefinition
                              ((this->super_cmCommand).Makefile,&local_158,
                               local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start);
                  }
                }
                else {
                  cmCryptoHash::HashFile(&local_4a0,local_648._M_head_impl,&local_448);
                  if ((cmFileCommand *)local_4a0._M_string_length == (cmFileCommand *)0x0) {
                    local_618 = (undefined1  [8])local_608;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_618,"DOWNLOAD cannot compute hash on downloaded file"
                               ,"");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                    if (local_618 != (undefined1  [8])local_608) {
                      operator_delete((void *)local_618,
                                      CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                               local_608[0]._M_local_buf[0]) + 1);
                    }
LAB_002047af:
                    bVar6 = false;
                    bVar5 = false;
                  }
                  else if ((local_638._M_string_length != local_4a0._M_string_length) ||
                          ((bVar6 = true,
                           (cmFileCommand *)local_638._M_string_length != (cmFileCommand *)0x0 &&
                           (iVar7 = bcmp(local_638._M_dataplus._M_p,local_4a0._M_dataplus._M_p,
                                         local_638._M_string_length), iVar7 != 0)))) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_618);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_618,"DOWNLOAD HASH mismatch",0x16);
                    poVar14 = std::endl<char,std::char_traits<char>>((ostream *)local_618);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  for file: [",0xd);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,local_448._M_dataplus._M_p,
                                         local_448._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
                    poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"    expected hash: [",0x14);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,local_638._M_dataplus._M_p,
                                         local_638._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
                    poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"      actual hash: [",0x14);
                    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar14,local_4a0._M_dataplus._M_p,
                                         local_4a0._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
                    poVar14 = std::endl<char,std::char_traits<char>>(poVar14);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"           status: [",0x14);
                    poVar14 = (ostream *)std::ostream::operator<<(poVar14,CVar8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,";\"",2);
                    pcVar9 = curl_easy_strerror(CVar8);
                    poVar14 = std::operator<<(poVar14,pcVar9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"]",2);
                    std::endl<char,std::char_traits<char>>(poVar14);
                    if (CVar8 == CURLE_OK && local_408._M_string_length != 0) {
                      std::operator+(&local_50,"1;HASH mismatch: expected: ",&local_638);
                      plVar15 = (long *)std::__cxx11::string::append((char *)&local_50);
                      psVar17 = (size_type *)(plVar15 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar15 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar17) {
                        local_b0.field_2._M_allocated_capacity = *psVar17;
                        local_b0.field_2._8_8_ = plVar15[3];
                        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                      }
                      else {
                        local_b0.field_2._M_allocated_capacity = *psVar17;
                        local_b0._M_dataplus._M_p = (pointer)*plVar15;
                      }
                      local_b0._M_string_length = plVar15[1];
                      *plVar15 = (long)psVar17;
                      plVar15[1] = 0;
                      *(undefined1 *)(plVar15 + 2) = 0;
                      std::operator+(&local_1b8,&local_b0,&local_4a0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                        operator_delete(local_b0._M_dataplus._M_p,
                                        local_b0.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                      }
                      cmMakefile::AddDefinition
                                ((this->super_cmCommand).Makefile,&local_408,
                                 local_1b8._M_dataplus._M_p);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                        operator_delete(local_1b8._M_dataplus._M_p,
                                        local_1b8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::__cxx11::stringbuf::str();
                    cmCommand::SetError(&this->super_cmCommand,&local_1b8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
                      operator_delete(local_1b8._M_dataplus._M_p,
                                      local_1b8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_618);
                    std::ios_base::~ios_base(local_5a8);
                    goto LAB_002047af;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
                    operator_delete(local_4a0._M_dataplus._M_p,
                                    local_4a0.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar6) goto LAB_002047dc;
                }
              }
              else {
                CVar8 = curl_easy_setopt(data,CURLOPT_NOPROGRESS,0);
                if (CVar8 == CURLE_OK) {
                  CVar8 = curl_easy_setopt(data,CURLOPT_PROGRESSFUNCTION,
                                           anon_unknown.dwarf_648791::cmFileDownloadProgressCallback
                                          );
                  if (CVar8 == CURLE_OK) {
                    CVar8 = curl_easy_setopt(data,CURLOPT_PROGRESSDATA,local_478);
                    if (CVar8 == CURLE_OK) goto LAB_002041ef;
                    local_618 = (undefined1  [8])local_608;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_618,"DOWNLOAD cannot set progress data: ","");
                    curl_easy_strerror(CVar8);
                    std::__cxx11::string::append(local_618);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                  }
                  else {
                    local_618 = (undefined1  [8])local_608;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_618,"DOWNLOAD cannot set progress function: ","");
                    curl_easy_strerror(CVar8);
                    std::__cxx11::string::append(local_618);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                  }
                }
                else {
                  local_618 = (undefined1  [8])local_608;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_618,"DOWNLOAD cannot set noprogress value: ","");
                  curl_easy_strerror(CVar8);
                  std::__cxx11::string::append(local_618);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
                }
LAB_0020425e:
                if (local_618 != (undefined1  [8])local_608) {
                  operator_delete((void *)local_618,
                                  CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                           local_608[0]._M_local_buf[0]) + 1);
                }
                bVar5 = false;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_478._16_8_ != &local_458) {
                operator_delete((void *)local_478._16_8_,local_458._M_allocated_capacity + 1);
              }
            }
            else {
              local_618 = (undefined1  [8])local_608;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_618,"DOWNLOAD cannot set write data: ","");
              curl_easy_strerror(CVar8);
              std::__cxx11::string::append(local_618);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
LAB_00203f34:
              if (local_618 != (undefined1  [8])local_608) {
                operator_delete((void *)local_618,
                                CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                         local_608[0]._M_local_buf[0]) + 1);
              }
              bVar5 = false;
            }
            if (local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start != (char *)0x0) {
              operator_delete(local_1e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1e8.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,&local_90);
            bVar5 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,&local_70);
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_618 = (undefined1  [8])local_608;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_618,"DOWNLOAD cannot set url: ","");
        curl_easy_strerror(CVar8);
        std::__cxx11::string::append(local_618);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
LAB_00203953:
        if (local_618 != (undefined1  [8])local_608) {
          operator_delete((void *)local_618,
                          CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                   local_608[0]._M_local_buf[0]) + 1);
        }
        bVar5 = false;
      }
      anon_unknown.dwarf_648791::cURLEasyGuard::~cURLEasyGuard(&local_480);
    }
    else {
      local_618 = (undefined1  [8])local_608;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_618,"DOWNLOAD cannot open file for write.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_618);
LAB_0020322b:
      if (local_618 != (undefined1  [8])local_608) {
        operator_delete((void *)local_618,
                        CONCAT71(local_608[0]._M_allocated_capacity._1_7_,
                                 local_608[0]._M_local_buf[0]) + 1);
      }
      bVar5 = false;
    }
    local_3e8 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_3e8 + *(long *)(_VTT[-2]._M_local_buf + 8)) = _vtable;
    std::filebuf::~filebuf((filebuf *)&local_3e0);
    std::ios_base::~ios_base(local_2f0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_618,
                   "DOWNLOAD error: cannot create directory \'",&local_428);
    plVar15 = (long *)std::__cxx11::string::append(local_618);
    local_3e8 = (undefined1  [8])&local_3d8;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 == paVar16) {
      local_3d8._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_3d8._8_8_ = plVar15[3];
    }
    else {
      local_3d8._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_3e8 = (undefined1  [8])*plVar15;
    }
    local_3e0 = plVar15[1];
    *plVar15 = (long)paVar16;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    if (local_618 != (undefined1  [8])local_608) {
      operator_delete((void *)local_618,
                      CONCAT71(local_608[0]._M_allocated_capacity._1_7_,local_608[0]._M_local_buf[0]
                              ) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_3e8);
    if (local_3e8 != (undefined1  [8])&local_3d8) {
      operator_delete((void *)local_3e8,local_3d8._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
LAB_00203b77:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
            ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)&local_648);
  if (local_178 != &local_168) {
    operator_delete(local_178,CONCAT71(uStack_167,local_168) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,
                    CONCAT71(local_638.field_2._M_allocated_capacity._1_7_,
                             local_638.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p,
                    CONCAT71(local_408.field_2._M_allocated_capacity._1_7_,
                             local_408.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  return bVar5;
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string netrc_level = this->Makefile->GetSafeDefinition("CMAKE_NETRC");
  std::string netrc_file =
    this->Makefile->GetSafeDefinition("CMAKE_NETRC_FILE");
  std::string expectedHash;
  std::string hashMatchMSG;
  std::unique_ptr<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(*i);
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "NETRC_FILE") {
      ++i;
      if (i != args.end()) {
        netrc_file = *i;
      } else {
        this->SetError("DOWNLOAD missing file value for NETRC_FILE.");
        return false;
      }
    } else if (*i == "NETRC") {
      ++i;
      if (i != args.end()) {
        netrc_level = *i;
      } else {
        this->SetError("DOWNLOAD missing level value for NETRC.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash = cm::make_unique<cmCryptoHash>(cmCryptoHash::AlgoMD5);
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = std::unique_ptr<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << 0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir) && !cmSystemTools::MakeDirectory(dir)) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#  if defined(_WIN32)
  url = fix_file_url_windows(url);
#  endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  // check to see if netrc parameters have been specified
  // local command args takes precedence over CMAKE_NETRC*
  netrc_level = cmSystemTools::UpperCase(netrc_level);
  std::string const& netrc_option_err =
    cmCurlSetNETRCOption(curl, netrc_level, netrc_file);
  if (!netrc_option_err.empty()) {
    this->SetError(netrc_option_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, &fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = nullptr;
  for (std::string const& h : curl_headers) {
    headers = ::curl_slist_append(headers, h.c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << static_cast<int>(res) << ";\"" << ::curl_easy_strerror(res)
           << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << static_cast<int>(res) << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, chunkDebug.data());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}